

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<kj::ArrayPtr<const_unsigned_char>_>::setCapacity
          (Vector<kj::ArrayPtr<const_unsigned_char>_> *this,size_t newSize)

{
  ArrayPtr<const_unsigned_char> *pAVar1;
  RemoveConst<kj::ArrayPtr<const_unsigned_char>_> *pRVar2;
  ArrayPtr<const_unsigned_char> *pAVar3;
  size_t __n;
  ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_> local_38;
  
  pAVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)pAVar1 >> 4)) {
    (this->builder).pos = pAVar1 + newSize;
  }
  pAVar3 = (ArrayPtr<const_unsigned_char> *)
           _::HeapArrayDisposer::allocateImpl
                     (0x10,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = pAVar3 + newSize;
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pAVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pAVar1;
  local_38.ptr = pAVar3;
  if (__n != 0) {
    memcpy(pAVar3,pAVar1,__n);
  }
  local_38.pos = (RemoveConst<kj::ArrayPtr<const_unsigned_char>_> *)((long)pAVar3 + __n);
  ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_>::operator=(&this->builder,&local_38);
  pAVar3 = local_38.endPtr;
  pRVar2 = local_38.pos;
  pAVar1 = local_38.ptr;
  if (local_38.ptr != (ArrayPtr<const_unsigned_char> *)0x0) {
    local_38.ptr = (ArrayPtr<const_unsigned_char> *)0x0;
    local_38.pos = (RemoveConst<kj::ArrayPtr<const_unsigned_char>_> *)0x0;
    local_38.endPtr = (ArrayPtr<const_unsigned_char> *)0x0;
    (*(code *)**(undefined8 **)local_38.disposer)
              (local_38.disposer,pAVar1,0x10,(long)pRVar2 - (long)pAVar1 >> 4,
               (long)pAVar3 - (long)pAVar1 >> 4,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }